

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

size_t quicly_send_version_negotiation
                 (quicly_context_t *ctx,ptls_iovec_t dest_cid,ptls_iovec_t src_cid,
                 uint32_t *versions,void *payload)

{
  uint8_t *puVar1;
  uint *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  ulong in_R8;
  uint32_t *in_R9;
  uint32_t grease_version;
  uint32_t *v;
  uint8_t *dst;
  uint local_44;
  uint32_t *local_40;
  uint8_t *local_38;
  
  (**(code **)*in_RDI)(v);
  *(byte *)v = (byte)*v | 0x80;
  puVar1 = quicly_encode32((uint8_t *)((long)v + 1),0);
  local_38 = puVar1 + 1;
  *puVar1 = (uint8_t)in_RDX;
  if (in_RDX != 0) {
    memcpy(local_38,in_RSI,in_RDX);
    local_38 = local_38 + in_RDX;
  }
  puVar1 = local_38 + 1;
  *local_38 = (uint8_t)in_R8;
  local_40 = in_R9;
  local_38 = puVar1;
  if (in_R8 != 0) {
    memcpy(puVar1,in_RCX,in_R8);
    local_38 = puVar1 + in_R8;
  }
  for (; *local_40 != 0; local_40 = local_40 + 1) {
    local_38 = quicly_encode32(local_38,*local_40);
  }
  local_44 = 0;
  if (3 < in_R8) {
    local_44 = *in_RCX;
  }
  puVar1 = quicly_encode32(local_38,local_44 & 0xf0f0f0f0 | 0xa0a0a0a);
  return (long)puVar1 - (long)v;
}

Assistant:

size_t quicly_send_version_negotiation(quicly_context_t *ctx, ptls_iovec_t dest_cid, ptls_iovec_t src_cid, const uint32_t *versions,
                                       void *payload)
{
    uint8_t *dst = payload;

    /* type_flags */
    ctx->tls->random_bytes(dst, 1);
    *dst |= QUICLY_LONG_HEADER_BIT;
    ++dst;
    /* version */
    dst = quicly_encode32(dst, 0);
    /* connection-id */
    *dst++ = dest_cid.len;
    if (dest_cid.len != 0) {
        memcpy(dst, dest_cid.base, dest_cid.len);
        dst += dest_cid.len;
    }
    *dst++ = src_cid.len;
    if (src_cid.len != 0) {
        memcpy(dst, src_cid.base, src_cid.len);
        dst += src_cid.len;
    }
    /* supported_versions */
    for (const uint32_t *v = versions; *v != 0; ++v)
        dst = quicly_encode32(dst, *v);
    /* add a greasing version. This also covers the case where an empty list is specified by the caller to indicate rejection. */
    uint32_t grease_version = 0;
    if (src_cid.len >= sizeof(grease_version))
        memcpy(&grease_version, src_cid.base, sizeof(grease_version));
    grease_version = (grease_version & 0xf0f0f0f0) | 0x0a0a0a0a;
    dst = quicly_encode32(dst, grease_version);

    return dst - (uint8_t *)payload;
}